

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void block_free(block_s *blk)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  block_s *mem;
  block_node_s *pos;
  size_t i;
  block_s *blk_local;
  
  LOCK();
  puVar1 = &blk->ref;
  uVar2 = *puVar1;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (uVar2 == 1) {
    memset(blk + 1,0,0x7ff0);
    fio_lock(&memory.lock);
    fio_ls_embd_push(&memory.available,(fio_ls_embd_s *)(blk + 1));
    mem = blk->parent;
    LOCK();
    puVar1 = &mem->root_ref;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (uVar2 == 1) {
      for (pos = (block_node_s *)0x0; pos < (block_node_s *)0x100;
          pos = (block_node_s *)((long)&(pos->dont_touch).parent + 1)) {
        fio_ls_embd_remove((fio_ls_embd_s *)(mem + (long)pos * 0x800 + 1));
      }
      fio_unlock(&memory.lock);
      sys_free(mem,0x800000);
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:7146): memory allocator returned %p to the system"
                       ,mem);
      }
    }
    else {
      fio_unlock(&memory.lock);
    }
  }
  return;
}

Assistant:

static inline void block_free(block_s *blk) {
  if (fio_atomic_sub(&blk->ref, 1))
    return;

  memset(blk + 1, 0, (FIO_MEMORY_BLOCK_SIZE - sizeof(*blk)));
  fio_lock(&memory.lock);
  fio_ls_embd_push(&memory.available, &((block_node_s *)blk)->node);

  blk = blk->parent;

  if (fio_atomic_sub(&blk->root_ref, 1)) {
    fio_unlock(&memory.lock);
    return;
  }
  // fio_unlock(&memory.lock);
  // return;

  /* remove all of the root block's children (slices) from the memory pool */
  for (size_t i = 0; i < FIO_MEMORY_BLOCKS_PER_ALLOCATION; ++i) {
    block_node_s *pos =
        (block_node_s *)((uintptr_t)blk + (i * FIO_MEMORY_BLOCK_SIZE));
    fio_ls_embd_remove(&pos->node);
  }

  fio_unlock(&memory.lock);
  sys_free(blk, FIO_MEMORY_BLOCK_SIZE * FIO_MEMORY_BLOCKS_PER_ALLOCATION);
  FIO_LOG_DEBUG("memory allocator returned %p to the system", (void *)blk);
  FIO_MEMORY_ON_BLOCK_FREE();
}